

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_morton.h
# Opt level: O1

void std::
     __move_median_to_first<embree::sse2::BVHBuilderMorton::BuildPrim*,__gnu_cxx::__ops::_Iter_less_iter>
               (undefined8 *__result,uint *__a,uint *__b,uint *__c)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  undefined8 uVar4;
  
  uVar1 = *__a;
  uVar2 = *__b;
  uVar3 = *__c;
  if (uVar2 <= uVar1) {
    if (uVar1 < uVar3) {
      uVar4 = *__result;
      *__result = *(undefined8 *)__a;
      *(undefined8 *)__a = uVar4;
      return;
    }
    uVar4 = *__result;
    if (uVar2 < uVar3) {
      *__result = *(undefined8 *)__c;
      *(undefined8 *)__c = uVar4;
      return;
    }
    *__result = *(undefined8 *)__b;
    *(undefined8 *)__b = uVar4;
    return;
  }
  if (uVar2 < uVar3) {
    uVar4 = *__result;
    *__result = *(undefined8 *)__b;
    *(undefined8 *)__b = uVar4;
    return;
  }
  uVar4 = *__result;
  if (uVar1 < uVar3) {
    *__result = *(undefined8 *)__c;
    *(undefined8 *)__c = uVar4;
    return;
  }
  *__result = *(undefined8 *)__a;
  *(undefined8 *)__a = uVar4;
  return;
}

Assistant:

__forceinline bool operator<(const BuildPrim &m) const { return code < m.code; }